

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::range_type> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::range_type>,64ul,cs_impl::default_allocator_provider>::
alloc<cs::range_type&>
          (allocator_type<cs_impl::any::holder<cs::range_type>,_64UL,_cs_impl::default_allocator_provider>
           *this,range_type *args)

{
  long lVar1;
  __int_type _Var2;
  holder<cs::range_type> *phVar3;
  new_allocator<cs_impl::any::holder<cs::range_type>_> *in_RSI;
  new_allocator<cs_impl::any::holder<cs::range_type>_> *in_RDI;
  holder<cs::range_type> *ptr;
  holder<cs::range_type> *in_stack_ffffffffffffffd8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      phVar3 = *(holder<cs::range_type> **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_001979a2;
    }
  }
  phVar3 = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::range_type>_>::allocate
                     (in_RSI,__n,in_RDI);
LAB_001979a2:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::range_type>>::
  construct<cs_impl::any::holder<cs::range_type>,cs::range_type&>
            (in_RDI,in_stack_ffffffffffffffd8,(range_type *)0x1979bd);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}